

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O1

CURLcode Curl_urldecode(char *string,size_t length,char **ostring,size_t *olen,urlreject ctrl)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  CURLcode CVar4;
  byte *pbVar5;
  long lVar6;
  long lVar7;
  
  if (length == 0) {
    length = strlen(string);
  }
  pbVar5 = (byte *)(*Curl_cmalloc)(length + 1);
  if (pbVar5 == (byte *)0x0) {
    CVar4 = CURLE_OUT_OF_MEMORY;
  }
  else {
    *ostring = (char *)pbVar5;
    do {
      if (length == 0) {
        *pbVar5 = 0;
        if (olen == (size_t *)0x0) {
          return CURLE_OK;
        }
        *olen = (long)pbVar5 - (long)*ostring;
        return CURLE_OK;
      }
      bVar3 = *string;
      lVar6 = -1;
      lVar7 = 1;
      if (((2 < length && bVar3 == 0x25) &&
          ((bVar1 = ((byte *)string)[1], (byte)(bVar1 - 0x30) < 10 ||
           ((bVar1 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) != 0)))))
          ) && ((bVar2 = ((byte *)string)[2], (byte)(bVar2 - 0x30) < 10 ||
                ((bVar2 - 0x41 < 0x26 &&
                 ((0x3f0000003fU >> ((ulong)(bVar2 - 0x41) & 0x3f) & 1) != 0)))))) {
        bVar3 = "0123456789ABCDEF"[(char)bVar1] << 4 | "0123456789ABCDEF"[(char)bVar2];
        lVar6 = -3;
        lVar7 = 3;
      }
      if ((bVar3 != 0 || ctrl != REJECT_ZERO) && (0x1f < bVar3 || ctrl != REJECT_CTRL)) {
        *pbVar5 = bVar3;
        pbVar5 = pbVar5 + 1;
      }
      else {
        (*Curl_cfree)(*ostring);
        *ostring = (char *)0x0;
      }
      string = (char *)((byte *)string + lVar7);
      length = length + lVar6;
    } while ((bVar3 != 0 || ctrl != REJECT_ZERO) && (0x1f < bVar3 || ctrl != REJECT_CTRL));
    CVar4 = CURLE_URL_MALFORMAT;
  }
  return CVar4;
}

Assistant:

CURLcode Curl_urldecode(const char *string, size_t length,
                        char **ostring, size_t *olen,
                        enum urlreject ctrl)
{
  size_t alloc;
  char *ns;

  DEBUGASSERT(string);
  DEBUGASSERT(ctrl >= REJECT_NADA); /* crash on TRUE/FALSE */

  alloc = (length?length:strlen(string));
  ns = malloc(alloc + 1);

  if(!ns)
    return CURLE_OUT_OF_MEMORY;

  /* store output string */
  *ostring = ns;

  while(alloc) {
    unsigned char in = *string;
    if(('%' == in) && (alloc > 2) &&
       ISXDIGIT(string[1]) && ISXDIGIT(string[2])) {
      /* this is two hexadecimal digits following a '%' */
      in = (unsigned char)(onehex2dec(string[1]) << 4) | onehex2dec(string[2]);

      string += 3;
      alloc -= 3;
    }
    else {
      string++;
      alloc--;
    }

    if(((ctrl == REJECT_CTRL) && (in < 0x20)) ||
       ((ctrl == REJECT_ZERO) && (in == 0))) {
      Curl_safefree(*ostring);
      return CURLE_URL_MALFORMAT;
    }

    *ns++ = in;
  }
  *ns = 0; /* terminate it */

  if(olen)
    /* store output size */
    *olen = ns - *ostring;

  return CURLE_OK;
}